

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  ulong uVar2;
  undefined2 uVar3;
  ulong uVar4;
  quint32 *pqVar5;
  quint32 *pqVar6;
  uchar *puVar7;
  ulong uVar8;
  quint32 qVar9;
  long in_FS_OFFSET;
  quint16 c16;
  quint32 c32;
  undefined2 local_3e;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = rasterBuffer->format;
  local_3c = QRgba64::toArgb32(color);
  local_3e = 0xaaaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            ((uchar *)&local_3e,&local_3c,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  uVar3 = local_3e;
  uVar2 = rasterBuffer->bytes_per_line;
  pqVar5 = (quint32 *)(rasterBuffer->m_buffer + (long)y * uVar2 + (long)x * 2);
  uVar8 = (ulong)width;
  if ((uVar2 & 0xffffffff) == uVar8 * 2) {
    uVar8 = (long)height * uVar8;
    if (((ulong)pqVar5 & 3) != 0) {
      *(undefined2 *)pqVar5 = local_3e;
      pqVar5 = (quint32 *)((long)pqVar5 + 2);
      uVar8 = uVar8 - 1;
    }
    if ((uVar8 & 1) != 0) {
      *(undefined2 *)((long)pqVar5 + uVar8 * 2 + -2) = local_3e;
    }
    (*qt_memfill32)(pqVar5,CONCAT22(local_3e,local_3e),(long)uVar8 / 2);
  }
  else if (0 < height) {
    qVar9 = CONCAT22(local_3e,local_3e);
    puVar7 = rasterBuffer->m_buffer + (long)x * 2 + (long)y * uVar2;
    do {
      uVar4 = uVar8;
      pqVar6 = pqVar5;
      if (((ulong)puVar7 & 3) != 0) {
        pqVar6 = (quint32 *)((long)pqVar5 + 2);
        *(undefined2 *)pqVar5 = uVar3;
        uVar4 = uVar8 - 1;
      }
      if ((uVar4 & 1) != 0) {
        *(undefined2 *)((long)pqVar6 + uVar4 * 2 + -2) = uVar3;
      }
      (*qt_memfill32)(pqVar6,qVar9,(long)uVar4 / 2);
      pqVar5 = (quint32 *)((long)pqVar5 + uVar2);
      puVar7 = puVar7 + uVar2;
      height = height + -1;
    } while (height != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint16(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint16 c16;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c16), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint16>(reinterpret_cast<quint16 *>(rasterBuffer->buffer()),
                         c16, x, y, width, height, rasterBuffer->bytesPerLine());
}